

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

bool __thiscall QDateTime::equals(QDateTime *this,QDateTime *other)

{
  QDateTimePrivate *pQVar1;
  ulong uVar2;
  qint64 qVar3;
  qint64 qVar4;
  ulong uVar5;
  uint uVar6;
  QDateTimePrivate *pQVar7;
  bool bVar8;
  
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar6 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar6 = (uint)pQVar1;
  }
  pQVar7 = (other->d).d;
  if ((uVar6 & 8) == 0) {
    if (((ulong)pQVar7 & 1) == 0) {
      pQVar7 = (QDateTimePrivate *)
               (ulong)(pQVar7->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    bVar8 = ((ulong)pQVar7 & 8) == 0;
  }
  else {
    if (((ulong)pQVar7 & 1) == 0) {
      uVar6 = (pQVar7->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
              super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    else {
      uVar6 = (uint)pQVar7;
    }
    if ((uVar6 & 8) == 0) {
      bVar8 = false;
    }
    else {
      if (((ulong)pQVar1 & 1) == 0) {
        qVar3 = pQVar1->m_msecs;
      }
      else {
        qVar3 = (long)pQVar1 >> 8;
      }
      if (((ulong)pQVar7 & 1) == 0) {
        qVar4 = pQVar7->m_msecs;
      }
      else {
        qVar4 = (long)pQVar7 >> 8;
      }
      bVar8 = usesSameOffset(&this->d,&other->d);
      if (!bVar8) {
        uVar5 = qVar3 - qVar4;
        uVar2 = -uVar5;
        if (0 < (long)uVar5) {
          uVar2 = uVar5;
        }
        if ((!SBORROW8(qVar3,qVar4)) && (uVar2 < 0x6ddd001)) {
          qVar3 = toMSecsSinceEpoch(this);
          qVar4 = toMSecsSinceEpoch(other);
          return qVar3 == qVar4;
        }
      }
      bVar8 = qVar3 == qVar4;
    }
  }
  return bVar8;
}

Assistant:

bool QDateTime::equals(const QDateTime &other) const
{
    if (!isValid())
        return !other.isValid();
    if (!other.isValid())
        return false;

    const qint64 thisMs = getMSecs(d);
    const qint64 yourMs = getMSecs(other.d);
    if (usesSameOffset(d, other.d) || areFarEnoughApart(thisMs, yourMs))
        return thisMs == yourMs;

    // Convert to UTC and compare
    return toMSecsSinceEpoch() == other.toMSecsSinceEpoch();
}